

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example3.cpp
# Opt level: O3

int main(void)

{
  undefined8 ******ppppppuVar1;
  undefined8 ******ppppppuVar2;
  bool bVar3;
  int iVar4;
  int rtperr;
  RTPPacket *p;
  uint16_t portbase;
  int num;
  timespec req;
  string ipstr;
  timespec rem;
  RTPSessionParams sessparams;
  MyRTPSession sess;
  int iStack_10934;
  timespec tStack_10930;
  undefined1 *puStack_10920;
  undefined8 uStack_10918;
  undefined1 uStack_10910;
  undefined7 uStack_1090f;
  RTPTransmissionParams RStack_10900;
  undefined8 uStack_108f0;
  undefined8 *****pppppuStack_108e8;
  undefined8 *****pppppuStack_108e0;
  undefined8 uStack_108d8;
  undefined1 uStack_108d0;
  undefined8 uStack_108cc;
  undefined8 uStack_108c4;
  undefined5 uStack_108bc;
  undefined3 uStack_108b7;
  undefined5 uStack_108b4;
  undefined8 uStack_108a8;
  timespec tStack_108a0;
  RTPSessionParams RStack_10890;
  RTPSession RStack_107e8;
  
  jrtplib::RTPSession::RTPSession(&RStack_107e8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  puStack_10920 = &uStack_10910;
  uStack_10918 = 0;
  uStack_10910 = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter local portbase:",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Number of seconds you wish to wait:",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&iStack_10934);
  RStack_10900.protocol = IPv4UDPProto;
  RStack_10900._vptr_RTPTransmissionParams = (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013b040
  ;
  uStack_108d8 = 0;
  RStack_10900._12_2_ = 5000;
  uStack_108f0 = 0;
  uStack_108d0 = 1;
  uStack_108cc = 0x800000008000;
  uStack_108c4 = 0x800000008000;
  uStack_108a8 = 0;
  uStack_108bc = 0;
  uStack_108b7 = 0;
  uStack_108b4 = 0;
  pppppuStack_108e8 = &pppppuStack_108e8;
  pppppuStack_108e0 = &pppppuStack_108e8;
  jrtplib::RTPSessionParams::RTPSessionParams(&RStack_10890);
  RStack_10890.owntsunit = 0.000125;
  RStack_10890.acceptown = true;
  iVar4 = jrtplib::RTPSession::Create(&RStack_107e8,&RStack_10890,&RStack_10900,IPv4UDPProto);
  checkerror(iVar4);
  if (0 < iStack_10934) {
    iVar4 = 1;
    do {
      jrtplib::RTPSession::BeginDataAccess(&RStack_107e8);
      bVar3 = jrtplib::RTPSession::GotoFirstSourceWithData(&RStack_107e8);
      while (bVar3 != false) {
        while (p = jrtplib::RTPSession::GetNextPacket(&RStack_107e8), p != (RTPPacket *)0x0) {
          puts("Got packet !");
          jrtplib::RTPSession::DeletePacket(&RStack_107e8,p);
        }
        bVar3 = jrtplib::RTPSession::GotoNextSourceWithData(&RStack_107e8);
      }
      jrtplib::RTPSession::EndDataAccess(&RStack_107e8);
      rtperr = jrtplib::RTPSession::Poll(&RStack_107e8);
      checkerror(rtperr);
      tStack_10930.tv_sec = 1;
      tStack_10930.tv_nsec = 0;
      nanosleep(&tStack_10930,&tStack_108a0);
      bVar3 = iVar4 < iStack_10934;
      iVar4 = iVar4 + 1;
    } while (bVar3);
  }
  tStack_10930.tv_sec = 0x4024000000000000;
  jrtplib::RTPSession::BYEDestroy(&RStack_107e8,(RTPTime *)&tStack_10930,(void *)0x0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)RStack_10890.cname._M_dataplus._M_p != &RStack_10890.cname.field_2) {
    operator_delete(RStack_10890.cname._M_dataplus._M_p,
                    RStack_10890.cname.field_2._M_allocated_capacity + 1);
  }
  RStack_10900._vptr_RTPTransmissionParams = (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013b040
  ;
  ppppppuVar2 = (undefined8 ******)pppppuStack_108e8;
  while (ppppppuVar2 != &pppppuStack_108e8) {
    ppppppuVar1 = (undefined8 ******)*ppppppuVar2;
    operator_delete(ppppppuVar2,0x18);
    ppppppuVar2 = ppppppuVar1;
  }
  if (puStack_10920 != &uStack_10910) {
    operator_delete(puStack_10920,CONCAT71(uStack_1090f,uStack_10910) + 1);
  }
  jrtplib::RTPSession::~RTPSession(&RStack_107e8);
  return 0;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyRTPSession sess;
	uint16_t portbase;
	std::string ipstr;
	int status,i,num;

        // First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << std::endl;
	std::cout << "Number of seconds you wish to wait:" << std::endl;
	std::cin >> num;
	
	// Now, we'll create a RTP session, set the destination
	// and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be just use 8000 samples per second.
	sessparams.SetOwnTimestampUnit(1.0/8000.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}